

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

uint32_t cab_checksum_cfdata(void *p,size_t bytes,uint32_t seed)

{
  uint32_t uVar1;
  uint uVar2;
  byte *pbVar3;
  uint local_30;
  uint32_t t;
  uint32_t sum;
  uchar *b;
  uint32_t seed_local;
  size_t bytes_local;
  void *p_local;
  
  uVar1 = cab_checksum_cfdata_4(p,bytes,seed);
  pbVar3 = (byte *)((long)p + (bytes & 0xfffffffffffffffc));
  local_30 = 0;
  uVar2 = (uint)bytes & 3;
  _t = pbVar3;
  if (uVar2 != 1) {
    if (uVar2 != 2) {
      if (uVar2 != 3) goto LAB_00177b16;
      _t = pbVar3 + 1;
      local_30 = (uint)*pbVar3 << 0x10;
    }
    local_30 = (uint)*_t << 8 | local_30;
    _t = _t + 1;
  }
  local_30 = *_t | local_30;
LAB_00177b16:
  return local_30 ^ uVar1;
}

Assistant:

static uint32_t
cab_checksum_cfdata(const void *p, size_t bytes, uint32_t seed)
{
	const unsigned char *b;
	uint32_t sum;
	uint32_t t;

	sum = cab_checksum_cfdata_4(p, bytes, seed);
	b = p;
	b += bytes & ~3;
	t = 0;
	switch (bytes & 3) {
	case 3:
		t |= ((uint32_t)(*b++)) << 16;
		/* FALL THROUGH */
	case 2:
		t |= ((uint32_t)(*b++)) << 8;
		/* FALL THROUGH */
	case 1:
		t |= *b;
		/* FALL THROUGH */
	default:
		break;
	}
	sum ^= t;

	return (sum);
}